

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelDefines::~IfcRelDefines(IfcRelDefines *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0xc];
  *(void **)&this->field_0x88 = vtt[0xd];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0xe];
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObject>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObject>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObject>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObject>_>_>
                   *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).
                      field_0x10);
  IfcRoot::~IfcRoot((IfcRoot *)this,vtt + 2);
  return;
}

Assistant:

IfcRelDefines() : Object("IfcRelDefines") {}